

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O0

void __thiscall Gillespie::Initialize(Gillespie *this)

{
  runtime_error *this_00;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  shared_ptr<Reaction> local_30;
  int local_20;
  int i;
  Gillespie *local_10;
  Gillespie *this_local;
  
  local_10 = this;
  if ((this->initialized_ & 1U) == 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Gillespie: Reaction propensities have already been initialized.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_20 = 0;
  while( true ) {
    uVar1 = (ulong)local_20;
    sVar2 = std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
            size(&this->reactions_);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
             operator[](&this->reactions_,(long)local_20);
    std::shared_ptr<Reaction>::shared_ptr(&local_30,pvVar3);
    UpdatePropensity(this,&local_30);
    std::shared_ptr<Reaction>::~shared_ptr(&local_30);
    local_20 = local_20 + 1;
  }
  this->initialized_ = true;
  return;
}

Assistant:

void Gillespie::Initialize() {
  // Check that propensities have not already been initialized.
  if (initialized_ == true) {
    throw std::runtime_error(
        "Gillespie: Reaction propensities have already been initialized.");
  }
  // Update all propensities
  for (int i = 0; i < reactions_.size(); i++) {
    UpdatePropensity(reactions_[i]);
  }
  // Make sure prop sum is starting from 0, sum over all propensities.
  // alpha_sum_ = 0;
  // for (const auto &alpha : alpha_list_) {
  //  alpha_sum_ += alpha;
  // }
  initialized_ = true;
}